

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O2

int glfwGetOSMesaColorBuffer(GLFWwindow *handle,int *width,int *height,int *format,void **buffer)

{
  int iVar1;
  char *format_00;
  GLint mesaFormat;
  GLint mesaHeight;
  GLint mesaWidth;
  void *mesaBuffer;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/glfw/src/osmesa_context.c"
                  ,299,"int glfwGetOSMesaColorBuffer(GLFWwindow *, int *, int *, int *, void **)");
  }
  if (_glfw.initialized == 0) {
    iVar1 = 0x10001;
    format_00 = (char *)0x0;
  }
  else {
    iVar1 = (*_glfw.osmesa.GetColorBuffer)
                      (*(OSMesaContext *)(handle + 0x298),&mesaWidth,&mesaHeight,&mesaFormat,
                       &mesaBuffer);
    if (iVar1 != 0) {
      if (width != (int *)0x0) {
        *width = mesaWidth;
      }
      if (height != (int *)0x0) {
        *height = mesaHeight;
      }
      if (format != (int *)0x0) {
        *format = mesaFormat;
      }
      if (buffer == (void **)0x0) {
        return 1;
      }
      *buffer = mesaBuffer;
      return 1;
    }
    format_00 = "OSMesa: Failed to retrieve color buffer";
    iVar1 = 0x10008;
  }
  _glfwInputError(iVar1,format_00);
  return 0;
}

Assistant:

GLFWAPI int glfwGetOSMesaColorBuffer(GLFWwindow* handle, int* width,
                                     int* height, int* format, void** buffer)
{
    void* mesaBuffer;
    GLint mesaWidth, mesaHeight, mesaFormat;
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (!OSMesaGetColorBuffer(window->context.osmesa.handle,
                              &mesaWidth, &mesaHeight,
                              &mesaFormat, &mesaBuffer))
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "OSMesa: Failed to retrieve color buffer");
        return GLFW_FALSE;
    }

    if (width)
        *width = mesaWidth;
    if (height)
        *height = mesaHeight;
    if (format)
        *format = mesaFormat;
    if (buffer)
        *buffer = mesaBuffer;

    return GLFW_TRUE;
}